

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O2

Node48 * duckdb::Node48::New(ART *art,Node *node)

{
  uint8_t *puVar1;
  FixedSizeAllocator *this;
  IndexPointer IVar2;
  Node48 *pNVar3;
  long lVar4;
  Node ptr;
  
  this = Node::GetAllocator(art,NODE_48);
  IVar2 = FixedSizeAllocator::New(this);
  ptr.super_IndexPointer.data = (IndexPointer)(IVar2.data & 0xffffffffffffff | 0x500000000000000);
  (node->super_IndexPointer).data = (idx_t)ptr;
  pNVar3 = Node::Ref<duckdb::Node48>(art,ptr,NODE_48);
  pNVar3->count = '\0';
  for (lVar4 = 1; lVar4 != 0x101; lVar4 = lVar4 + 1) {
    pNVar3->child_index[lVar4 + -1] = '0';
  }
  for (lVar4 = 0x21; lVar4 != 0x51; lVar4 = lVar4 + 1) {
    puVar1 = pNVar3->child_index + lVar4 * 8 + -1;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
  }
  return pNVar3;
}

Assistant:

Node48 &Node48::New(ART &art, Node &node) {
	node = Node::GetAllocator(art, NODE_48).New();
	node.SetMetadata(static_cast<uint8_t>(NODE_48));
	auto &n48 = Node::Ref<Node48>(art, node, NODE_48);

	n48.count = 0;
	for (uint16_t i = 0; i < Node256::CAPACITY; i++) {
		n48.child_index[i] = EMPTY_MARKER;
	}
	for (uint8_t i = 0; i < CAPACITY; i++) {
		n48.children[i].Clear();
	}

	return n48;
}